

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O2

void __thiscall SkipList::~SkipList(SkipList *this)

{
  std::_Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::~_Vector_base
            (&(this->tail).next.
              super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>);
  std::_Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::~_Vector_base
            (&(this->head).next.
              super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>);
  return;
}

Assistant:

bool SkipList::insertElement(int value) {
    std::vector<Element *> update((unsigned long long) (MAX_HEIGHT + 1));
    Element *p = &head;

    for (int i = height; i >= 0; --i) {
        while (p->next[i]->value < value) {
            p = p->next[i];
        }
        update[i] = p;
    }
    p = p->next[0];

    if (p->value == value) {
        return false;    // key x exists already in list
    }

    int new_height = randomHeight();
    if (new_height > height) {  // link new Element to head, adjust list height
        for (int i = height + 1; i <= new_height; ++i) {
            update[i] = &head;
        }
        height = new_height;
    }

    // create new Element with height new_height and key x
    p = new Element(value, new_height);

    // insert p into level i lists immediately after Element update[i]
    for (int i = 0; i <= new_height; ++i) {
        p->next[i] = update[i]->next[i];
        update[i]->next[i] = p;
    }
    return true;
}